

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_coroutine_wrap(lua_State *L)

{
  ulong uVar1;
  
  lj_cf_coroutine_create(L);
  lua_pushcclosure(L,lj_ffh_coroutine_wrap_aux,1);
  uVar1 = (ulong)L->top[-1].u32.lo;
  *(undefined1 *)(uVar1 + 6) = 0x24;
  *(uint32_t *)(uVar1 + 0x10) = (L->glref).ptr32 + 0xec;
  *(uint32_t *)((ulong)L->top[-1].u32.lo + 0x10) = (L->glref).ptr32 + 0x1374;
  return 1;
}

Assistant:

LJLIB_CF(coroutine_wrap)
{
  lj_cf_coroutine_create(L);
  lj_lib_pushcc(L, lj_ffh_coroutine_wrap_aux, FF_coroutine_wrap_aux, 1);
  setpc_wrap_aux(L, funcV(L->top-1));
  return 1;
}